

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

void send_packet_to_downstream
               (ssh_sharing_connstate *cs,int type,void *pkt,int pktlen,share_channel *chan)

{
  BinarySink *pBVar1;
  uint8_t *p;
  unsigned_long uVar2;
  strbuf *psVar3;
  uint uVar4;
  int iVar5;
  unsigned_long val;
  size_t sVar6;
  void *data;
  ptrlen pVar7;
  BinarySource src [1];
  
  if (cs->sock != (Socket *)0x0) {
    if (type != 0x5e) {
      psVar3 = strbuf_new_nm();
      pBVar1 = psVar3->binarysink_;
      BinarySink_put_uint32(pBVar1,0);
      BinarySink_put_byte(pBVar1,(uchar)type);
      BinarySink_put_data(pBVar1,pkt,(long)pktlen);
      uVar4 = (int)psVar3->len - 4;
      *(uint *)psVar3->s =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000;
      (*cs->sock->vt->write)(cs->sock,psVar3->s,psVar3->len);
      strbuf_free(psVar3);
      return;
    }
    src[0].len = (size_t)pktlen;
    src[0].binarysource_ = src;
    src[0].pos = 0;
    src[0].err = BSE_NO_ERROR;
    src[0].data = pkt;
    uVar2 = BinarySource_get_uint32(src[0].binarysource_);
    pVar7 = BinarySource_get_string(src[0].binarysource_);
    do {
      data = pVar7.ptr;
      iVar5 = (int)pVar7.len;
      if ((ulong)(long)chan->downstream_maxpkt < pVar7.len) {
        iVar5 = chan->downstream_maxpkt;
      }
      psVar3 = strbuf_new_nm();
      pBVar1 = psVar3->binarysink_;
      BinarySink_put_uint32(pBVar1,0);
      BinarySink_put_byte(pBVar1,'^');
      BinarySink_put_uint32(pBVar1,uVar2 & 0xffffffff);
      val = (unsigned_long)iVar5;
      BinarySink_put_uint32(pBVar1,val);
      BinarySink_put_data(pBVar1,data,val);
      uVar4 = (int)psVar3->len - 4;
      *(uint *)psVar3->s =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000;
      (*cs->sock->vt->write)(cs->sock,psVar3->s,psVar3->len);
      strbuf_free(psVar3);
      sVar6 = pVar7.len - val;
      pVar7.len = sVar6;
      pVar7.ptr = (void *)((long)data + val);
    } while (sVar6 != 0);
  }
  return;
}

Assistant:

static void send_packet_to_downstream(struct ssh_sharing_connstate *cs,
                                      int type, const void *pkt, int pktlen,
                                      struct share_channel *chan)
{
    strbuf *packet;

    if (!cs->sock) /* throw away all packets destined for a dead downstream */
        return;

    if (type == SSH2_MSG_CHANNEL_DATA) {
        /*
         * Special case which we take care of at a low level, so as to
         * be sure to apply it in all cases. On rare occasions we
         * might find that we have a channel for which the
         * downstream's maximum packet size exceeds the max packet
         * size we presented to the server on its behalf. (This can
         * occur in X11 forwarding, where we have to send _our_
         * CHANNEL_OPEN_CONFIRMATION before we discover which if any
         * downstream the channel is destined for, so if that
         * downstream turns out to present a smaller max packet size
         * then we're in this situation.)
         *
         * If that happens, we just chop up the packet into pieces and
         * send them as separate CHANNEL_DATA packets.
         */
        BinarySource src[1];
        unsigned channel;
        ptrlen data;

        BinarySource_BARE_INIT(src, pkt, pktlen);
        channel = get_uint32(src);
        data = get_string(src);

        do {
            int this_len = (data.len > chan->downstream_maxpkt ?
                            chan->downstream_maxpkt : data.len);

            packet = strbuf_new_nm();
            put_uint32(packet, 0);     /* placeholder for length field */
            put_byte(packet, type);
            put_uint32(packet, channel);
            put_uint32(packet, this_len);
            put_data(packet, data.ptr, this_len);
            data.ptr = (const char *)data.ptr + this_len;
            data.len -= this_len;
            PUT_32BIT_MSB_FIRST(packet->s, packet->len-4);
            sk_write(cs->sock, packet->s, packet->len);
            strbuf_free(packet);
        } while (data.len > 0);
    } else {
        /*
         * Just do the obvious thing.
         */
        packet = strbuf_new_nm();
        put_uint32(packet, 0);     /* placeholder for length field */
        put_byte(packet, type);
        put_data(packet, pkt, pktlen);
        PUT_32BIT_MSB_FIRST(packet->s, packet->len-4);
        sk_write(cs->sock, packet->s, packet->len);
        strbuf_free(packet);
    }
}